

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O0

int __thiscall
beagle::cpu::BeagleCPUImpl<double,_1,_0>::setPartials
          (BeagleCPUImpl<double,_1,_0> *this,int bufferIndex,double *inPartials)

{
  void *pvVar1;
  int in_ESI;
  double *in_RDI;
  int k_1;
  int k;
  int i;
  int l;
  double *tmpRealPartialsOffset;
  double *inPartialsOffset;
  int in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc4;
  int local_38;
  int local_34;
  undefined8 *local_30;
  int local_4;
  
  if ((in_ESI < 0) || (*(int *)((long)in_RDI + 0xc) <= in_ESI)) {
    local_4 = -5;
  }
  else {
    if (*(long *)((long)in_RDI[0x16] + (long)in_ESI * 8) == 0) {
      pvVar1 = malloc((long)*(int *)((long)in_RDI + 0x3c) << 3);
      *(void **)((long)in_RDI[0x16] + (long)in_ESI * 8) = pvVar1;
      if (*(long *)((long)in_RDI[0x16] + (long)in_ESI * 8) == 0) {
        return -2;
      }
    }
    local_30 = *(undefined8 **)((long)in_RDI[0x16] + (long)in_ESI * 8);
    for (local_34 = 0; local_34 < *(int *)((long)in_RDI + 0x34); local_34 = local_34 + 1) {
      for (local_38 = 0; local_38 < *(int *)((long)in_RDI + 0x14); local_38 = local_38 + 1) {
        beagleMemCpy<double>
                  ((double *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),in_RDI,0)
        ;
        local_30 = local_30 + *(int *)((long)in_RDI + 0x24);
        for (in_stack_ffffffffffffffc4 = *(int *)((long)in_RDI + 0x24);
            in_stack_ffffffffffffffc4 < *(int *)((long)in_RDI + 0x2c);
            in_stack_ffffffffffffffc4 = in_stack_ffffffffffffffc4 + 1) {
          *local_30 = 0;
          local_30 = local_30 + 1;
        }
      }
      for (in_stack_ffffffffffffffc0 = 0;
          in_stack_ffffffffffffffc0 <
          *(int *)((long)in_RDI + 0x2c) * (*(int *)(in_RDI + 3) - *(int *)((long)in_RDI + 0x14));
          in_stack_ffffffffffffffc0 = in_stack_ffffffffffffffc0 + 1) {
        *local_30 = 0;
        local_30 = local_30 + 1;
      }
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

BEAGLE_CPU_TEMPLATE
int BeagleCPUImpl<BEAGLE_CPU_GENERIC>::setPartials(int bufferIndex,
                               const double* inPartials) {
    if (bufferIndex < 0 || bufferIndex >= kBufferCount)
        return BEAGLE_ERROR_OUT_OF_RANGE;
    if (gPartials[bufferIndex] == NULL) {
        gPartials[bufferIndex] = (REALTYPE*) malloc(sizeof(REALTYPE) * kPartialsSize);
        if (gPartials[bufferIndex] == 0L)
            return BEAGLE_ERROR_OUT_OF_MEMORY;
    }

    const double* inPartialsOffset = inPartials;
    REALTYPE* tmpRealPartialsOffset = gPartials[bufferIndex];
    for (int l = 0; l < kCategoryCount; l++) {
        for (int i = 0; i < kPatternCount; i++) {
            beagleMemCpy(tmpRealPartialsOffset, inPartialsOffset, kStateCount);
            tmpRealPartialsOffset += kStateCount;
            // Pad extra buffer with zeros
            for(int k = kStateCount; k < kPartialsPaddedStateCount; k++) {
                *tmpRealPartialsOffset++ = 0;
            }
            inPartialsOffset += kStateCount;
        }
        // Pad extra buffer with zeros
        for(int k = 0; k < kPartialsPaddedStateCount * (kPaddedPatternCount - kPatternCount); k++) {
            *tmpRealPartialsOffset++ = 0;
        }
    }

    return BEAGLE_SUCCESS;
}